

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O1

void __thiscall
streams_tests::streams_vector_reader_rvalue::test_method(streams_vector_reader_rvalue *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  initializer_list<unsigned_char> __l;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar3;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  undefined4 local_124;
  undefined1 local_120 [16];
  undefined1 *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  uint32_t varint;
  SpanReader reader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  undefined4 *local_b0;
  assertion_result local_a8;
  undefined4 **local_90;
  uint32_t *local_88;
  char *local_80;
  char *local_78;
  assertion_result local_70;
  lazy_ostream local_58;
  undefined1 *local_48;
  lazy_ostream *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._vptr_lazy_ostream = (_func_int **)CONCAT53(local_58._vptr_lazy_ostream._3_5_,0x31a782);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,__l,(allocator_type *)&local_a8);
  reader.m_data.m_size =
       (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  reader.m_data.m_data =
       data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  varint = 0;
  varint = ReadVarInt<SpanReader,(VarIntMode)0,unsigned_int>(&reader);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xb6;
  file.m_begin = (iterator)&local_f0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_100,msg);
  local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
  local_120._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_88 = &varint;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(varint == 0xd431);
  local_b0 = &local_124;
  local_124 = 0xd431;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_78 = "";
  local_40 = (lazy_ostream *)&local_88;
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3d30;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,(lazy_ostream *)local_120,1,2,REQUIRE,0xf6b53f,(size_t)&local_80,0xb6,
             &local_58,"54321U",&local_a8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x64fd6d;
  file_00.m_end = (iterator)0xb7;
  file_00.m_begin = (iterator)&local_138;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_148,
             msg_00);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(reader.m_data.m_size == 0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120._0_8_ = "reader.empty()";
  local_120._8_8_ = "";
  local_58.m_empty = false;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_150 = "";
  local_40 = (lazy_ostream *)local_120;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_58,1,0,WARN,_cVar3,(size_t)&local_158,0xb7);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_vector_reader_rvalue)
{
    std::vector<uint8_t> data{0x82, 0xa7, 0x31};
    SpanReader reader{data};
    uint32_t varint = 0;
    // Deserialize into r-value
    reader >> VARINT(varint);
    BOOST_CHECK_EQUAL(varint, 54321U);
    BOOST_CHECK(reader.empty());
}